

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSSetMassUserData(ARKodeMem ark_mem,void *user_data)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKLsMassMem local_10;
  
  iVar1 = arkLs_AccessMassMem(ark_mem,"arkLSSetMassUserData",&local_10);
  if (iVar1 == 0) {
    if (local_10->mass != (ARKLsMassFn)0x0) {
      local_10->M_data = user_data;
    }
    local_10->P_data = user_data;
  }
  return iVar1;
}

Assistant:

int arkLSSetMassUserData(ARKodeMem ark_mem, void* user_data)
{
  ARKLsMassMem arkls_mem;
  int retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARKLS_SUCCESS) { return (retval); }

  /* Set data for mass matrix */
  if (arkls_mem->mass != NULL) { arkls_mem->M_data = user_data; }

  /* Data for Mtimes is set in arkLSSetMassTimes */

  /* Set data for Preconditioner */
  arkls_mem->P_data = user_data;

  return (ARKLS_SUCCESS);
}